

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O2

string * cmsys::Glob::PatternToRegex
                   (string *__return_storage_ptr__,string *pattern,bool require_whole_string,
                   bool preserve_case)

{
  byte bVar1;
  undefined4 in_EAX;
  int iVar2;
  undefined7 in_register_00000011;
  byte *pbVar3;
  byte *pbVar4;
  char *__s;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  undefined4 uStack_38;
  int local_34;
  
  __s = "";
  iVar2 = (int)CONCAT71(in_register_00000011,require_whole_string);
  _uStack_38 = CONCAT44(iVar2,in_EAX);
  if (iVar2 != 0) {
    __s = "^";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)((long)&uStack_38 + 3));
  pbVar4 = (byte *)(pattern->_M_dataplus)._M_p;
  pbVar6 = pbVar4 + pattern->_M_string_length;
  do {
    if (pbVar4 == pbVar6) {
      if ((char)local_34 != '\0') {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    bVar1 = *pbVar4;
    if (bVar1 == 0x5b) {
      pbVar3 = pbVar4 + 1;
      lVar5 = 1;
      if (pbVar3 != pbVar6) {
        lVar5 = (ulong)(*pbVar3 == 0x5e || *pbVar3 == 0x21) + 1;
      }
      if (pbVar4 + lVar5 != pbVar6) {
        lVar5 = lVar5 + (ulong)(pbVar4[lVar5] == 0x5d);
      }
LAB_0032b8ac:
      pbVar7 = pbVar4 + lVar5;
      if (pbVar7 != pbVar6) {
        if (*pbVar7 != 0x5d) break;
        if (pbVar7 != pbVar6) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          if ((lVar5 != 1) && (*pbVar3 == 0x21)) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            pbVar3 = pbVar4 + 2;
          }
          for (; pbVar3 != pbVar7; pbVar3 = pbVar3 + 1) {
            if (*pbVar3 == 0x5c) {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            std::__cxx11::string::push_back((char)__return_storage_ptr__);
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          pbVar4 = pbVar7;
          goto LAB_0032b986;
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else if ((bVar1 == 0x3f) || (bVar1 == 0x2a)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      if ((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
    }
LAB_0032b986:
    pbVar4 = pbVar4 + 1;
  } while( true );
  lVar5 = lVar5 + 1;
  goto LAB_0032b8ac;
}

Assistant:

std::string Glob::PatternToRegex(const std::string& pattern,
                                 bool require_whole_string, bool preserve_case)
{
  // Incrementally build the regular expression from the pattern.
  std::string regex = require_whole_string ? "^" : "";
  std::string::const_iterator pattern_first = pattern.begin();
  std::string::const_iterator pattern_last = pattern.end();
  for (std::string::const_iterator i = pattern_first; i != pattern_last; ++i) {
    int c = *i;
    if (c == '*') {
      // A '*' (not between brackets) matches any string.
      // We modify this to not match slashes since the original glob
      // pattern documentation was meant for matching file name
      // components separated by slashes.
      regex += "[^/]*";
    } else if (c == '?') {
      // A '?' (not between brackets) matches any single character.
      // We modify this to not match slashes since the original glob
      // pattern documentation was meant for matching file name
      // components separated by slashes.
      regex += "[^/]";
    } else if (c == '[') {
      // Parse out the bracket expression.  It begins just after the
      // opening character.
      std::string::const_iterator bracket_first = i + 1;
      std::string::const_iterator bracket_last = bracket_first;

      // The first character may be complementation '!' or '^'.
      if (bracket_last != pattern_last &&
          (*bracket_last == '!' || *bracket_last == '^')) {
        ++bracket_last;
      }

      // If the next character is a ']' it is included in the brackets
      // because the bracket string may not be empty.
      if (bracket_last != pattern_last && *bracket_last == ']') {
        ++bracket_last;
      }

      // Search for the closing ']'.
      while (bracket_last != pattern_last && *bracket_last != ']') {
        ++bracket_last;
      }

      // Check whether we have a complete bracket string.
      if (bracket_last == pattern_last) {
        // The bracket string did not end, so it was opened simply by
        // a '[' that is supposed to be matched literally.
        regex += "\\[";
      } else {
        // Convert the bracket string to its regex equivalent.
        std::string::const_iterator k = bracket_first;

        // Open the regex block.
        regex += "[";

        // A regex range complement uses '^' instead of '!'.
        if (k != bracket_last && *k == '!') {
          regex += "^";
          ++k;
        }

        // Convert the remaining characters.
        for (; k != bracket_last; ++k) {
          // Backslashes must be escaped.
          if (*k == '\\') {
            regex += "\\";
          }

          // Store this character.
          regex += *k;
        }

        // Close the regex block.
        regex += "]";

        // Jump to the end of the bracket string.
        i = bracket_last;
      }
    } else {
      // A single character matches itself.
      int ch = c;
      if (!(('a' <= ch && ch <= 'z') || ('A' <= ch && ch <= 'Z') ||
            ('0' <= ch && ch <= '9'))) {
        // Escape the non-alphanumeric character.
        regex += "\\";
      }
#if defined(KWSYS_GLOB_CASE_INDEPENDENT)
      else {
        // On case-insensitive systems file names are converted to lower
        // case before matching.
        if (!preserve_case) {
          ch = tolower(ch);
        }
      }
#endif
      (void)preserve_case;
      // Store the character.
      regex.append(1, static_cast<char>(ch));
    }
  }

  if (require_whole_string) {
    regex += "$";
  }
  return regex;
}